

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int updatewindow(z_streamp strm,uint out)

{
  internal_state *piVar1;
  uint uVar2;
  voidpf pvVar3;
  uint local_30;
  uint dist;
  uint copy;
  inflate_state *state;
  uint out_local;
  z_streamp strm_local;
  
  piVar1 = strm->state;
  if (*(long *)(piVar1 + 0x40) == 0) {
    pvVar3 = (*strm->zalloc)(strm->opaque,1 << ((byte)*(undefined4 *)(piVar1 + 0x30) & 0x1f),1);
    *(voidpf *)(piVar1 + 0x40) = pvVar3;
    if (*(long *)(piVar1 + 0x40) == 0) {
      return 1;
    }
  }
  if (*(int *)(piVar1 + 0x34) == 0) {
    *(int *)(piVar1 + 0x34) = 1 << ((byte)*(undefined4 *)(piVar1 + 0x30) & 0x1f);
    *(undefined4 *)(piVar1 + 0x3c) = 0;
    *(undefined4 *)(piVar1 + 0x38) = 0;
  }
  uVar2 = out - strm->avail_out;
  if (uVar2 < *(uint *)(piVar1 + 0x34)) {
    local_30 = *(int *)(piVar1 + 0x34) - *(int *)(piVar1 + 0x3c);
    if (uVar2 < (uint)(*(int *)(piVar1 + 0x34) - *(int *)(piVar1 + 0x3c))) {
      local_30 = uVar2;
    }
    memcpy((void *)(*(long *)(piVar1 + 0x40) + (ulong)*(uint *)(piVar1 + 0x3c)),
           strm->next_out + -(ulong)uVar2,(ulong)local_30);
    uVar2 = uVar2 - local_30;
    if (uVar2 == 0) {
      *(uint *)(piVar1 + 0x3c) = local_30 + *(int *)(piVar1 + 0x3c);
      if (*(int *)(piVar1 + 0x3c) == *(int *)(piVar1 + 0x34)) {
        *(undefined4 *)(piVar1 + 0x3c) = 0;
      }
      if (*(uint *)(piVar1 + 0x38) < *(uint *)(piVar1 + 0x34)) {
        *(uint *)(piVar1 + 0x38) = local_30 + *(int *)(piVar1 + 0x38);
      }
    }
    else {
      memcpy(*(void **)(piVar1 + 0x40),strm->next_out + -(ulong)uVar2,(ulong)uVar2);
      *(uint *)(piVar1 + 0x3c) = uVar2;
      *(undefined4 *)(piVar1 + 0x38) = *(undefined4 *)(piVar1 + 0x34);
    }
  }
  else {
    memcpy(*(void **)(piVar1 + 0x40),strm->next_out + -(ulong)*(uint *)(piVar1 + 0x34),
           (ulong)*(uint *)(piVar1 + 0x34));
    *(undefined4 *)(piVar1 + 0x3c) = 0;
    *(undefined4 *)(piVar1 + 0x38) = *(undefined4 *)(piVar1 + 0x34);
  }
  return 0;
}

Assistant:

local int updatewindow(strm, out)
z_streamp strm;
unsigned out;
{
    struct inflate_state FAR *state;
    unsigned copy, dist;

    state = (struct inflate_state FAR *)strm->state;

    /* if it hasn't been done already, allocate space for the window */
    if (state->window == Z_NULL) {
        state->window = (unsigned char FAR *)
                        ZALLOC(strm, 1U << state->wbits,
                               sizeof(unsigned char));
        if (state->window == Z_NULL) return 1;
    }

    /* if window not in use yet, initialize */
    if (state->wsize == 0) {
        state->wsize = 1U << state->wbits;
        state->wnext = 0;
        state->whave = 0;
    }

    /* copy state->wsize or less output bytes into the circular window */
    copy = out - strm->avail_out;
    if (copy >= state->wsize) {
        zmemcpy(state->window, strm->next_out - state->wsize, state->wsize);
        state->wnext = 0;
        state->whave = state->wsize;
    }
    else {
        dist = state->wsize - state->wnext;
        if (dist > copy) dist = copy;
        zmemcpy(state->window + state->wnext, strm->next_out - copy, dist);
        copy -= dist;
        if (copy) {
            zmemcpy(state->window, strm->next_out - copy, copy);
            state->wnext = copy;
            state->whave = state->wsize;
        }
        else {
            state->wnext += dist;
            if (state->wnext == state->wsize) state->wnext = 0;
            if (state->whave < state->wsize) state->whave += dist;
        }
    }
    return 0;
}